

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O1

unsigned_long
NonAdaptingProcess(PaUtilBufferProcessor *bp,int *streamCallbackResult,
                  PaUtilChannelDescriptor *hostInputChannels,
                  PaUtilChannelDescriptor *hostOutputChannels,unsigned_long framesToProcess)

{
  long *plVar1;
  PaStreamCallbackTimeInfo *pPVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  PaUtilChannelDescriptor *pPVar8;
  PaUtilChannelDescriptor *pPVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  void **ppvVar16;
  void **ppvVar17;
  void *pvVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  double dVar21;
  unsigned_long local_68;
  
  if (*streamCallbackResult == 0) {
    local_68 = 0;
    bVar4 = false;
    bVar3 = false;
    do {
      uVar13 = bp->framesPerTempBuffer;
      if (framesToProcess <= bp->framesPerTempBuffer) {
        uVar13 = framesToProcess;
      }
      uVar10 = bp->inputChannelCount;
      uVar14 = (uint)uVar13;
      if ((ulong)uVar10 == 0) {
        ppvVar16 = (void **)0x0;
      }
      else {
        ppvVar17 = (void **)bp->tempInputBuffer;
        if (bp->userInputIsInterleaved == 0) {
          uVar7 = bp->bytesPerUserInputSample;
          if (((bp->userInputSampleFormatIsEqualToHost == 0) || (bp->hostInputIsInterleaved != 0))
             || (bp->hostInputChannels[0]->data == (void *)0x0)) {
            uVar19 = 0;
            uVar15 = 0;
            do {
              bp->tempInputBufferPtrs[uVar15] =
                   (void *)(uVar19 * uVar13 + (long)bp->tempInputBuffer);
              uVar15 = uVar15 + 1;
              uVar19 = (ulong)((int)uVar19 + uVar7);
            } while (uVar10 + (uVar10 == 0) != uVar15);
          }
          else {
            lVar11 = 0;
            do {
              *(undefined8 *)((long)bp->tempInputBufferPtrs + lVar11) =
                   *(undefined8 *)((long)&hostInputChannels->data + lVar11 * 2);
              lVar11 = lVar11 + 8;
            } while ((ulong)uVar10 << 3 != lVar11);
            bVar3 = true;
          }
          uVar7 = uVar7 * uVar14;
          ppvVar16 = bp->tempInputBufferPtrs;
          uVar12 = 1;
        }
        else {
          uVar7 = bp->bytesPerUserInputSample;
          ppvVar16 = ppvVar17;
          uVar12 = uVar10;
          if (((bp->userInputSampleFormatIsEqualToHost != 0) && (bp->hostInputIsInterleaved != 0))
             && (bp->hostInputChannels[0]->data != (void *)0x0)) {
            ppvVar17 = (void **)hostInputChannels->data;
            bVar3 = true;
            ppvVar16 = ppvVar17;
          }
        }
        if (bp->hostInputChannels[0]->data == (void *)0x0) {
          if (bp->inputChannelCount != 0) {
            uVar10 = 0;
            do {
              (*bp->inputZeroer)(ppvVar17,uVar12,uVar14);
              ppvVar17 = (void **)((long)ppvVar17 + (ulong)uVar7);
              uVar10 = uVar10 + 1;
            } while (uVar10 < bp->inputChannelCount);
          }
        }
        else if (bVar3) {
          uVar7 = bp->bytesPerHostInputSample;
          lVar11 = 0;
          do {
            plVar1 = (long *)((long)&hostInputChannels->data + lVar11);
            *plVar1 = *plVar1 + (ulong)*(uint *)((long)&hostInputChannels->stride + lVar11) *
                                uVar7 * uVar13;
            lVar11 = lVar11 + 0x10;
          } while ((ulong)(uVar10 + (uVar10 == 0)) << 4 != lVar11);
          bVar3 = true;
        }
        else {
          bVar3 = false;
          if (bp->inputChannelCount != 0) {
            uVar19 = 0;
            pPVar8 = hostInputChannels;
            do {
              (*bp->inputConverter)
                        (ppvVar17,uVar12,pPVar8->data,pPVar8->stride,uVar14,&bp->ditherGenerator);
              ppvVar17 = (void **)((long)ppvVar17 + (ulong)uVar7);
              pPVar8->data = (void *)((long)pPVar8->data +
                                     (ulong)bp->bytesPerHostInputSample * pPVar8->stride * uVar13);
              uVar19 = uVar19 + 1;
              pPVar8 = pPVar8 + 1;
            } while (uVar19 < bp->inputChannelCount);
          }
        }
      }
      uVar10 = bp->outputChannelCount;
      if ((ulong)uVar10 == 0) {
        pvVar18 = (void *)0x0;
      }
      else {
        if (bp->userOutputIsInterleaved == 0) {
          if ((bp->userOutputSampleFormatIsEqualToHost == 0) || (bp->hostOutputIsInterleaved != 0))
          {
            uVar7 = bp->bytesPerUserOutputSample;
            uVar19 = (ulong)uVar10;
            if (uVar10 < 2) {
              uVar19 = 1;
            }
            uVar10 = 0;
            uVar15 = 0;
            do {
              bp->tempOutputBufferPtrs[uVar15] =
                   (void *)(uVar10 * uVar13 + (long)bp->tempOutputBuffer);
              uVar15 = uVar15 + 1;
              uVar10 = uVar10 + uVar7;
              pPVar8 = (PaUtilChannelDescriptor *)&bp->tempOutputBufferPtrs;
            } while (uVar19 != uVar15);
            goto LAB_001070fb;
          }
          lVar11 = 0;
          do {
            *(undefined8 *)((long)bp->tempOutputBufferPtrs + lVar11) =
                 *(undefined8 *)((long)&hostOutputChannels->data + lVar11 * 2);
            lVar11 = lVar11 + 8;
          } while ((ulong)uVar10 << 3 != lVar11);
          pPVar9 = (PaUtilChannelDescriptor *)&bp->tempOutputBufferPtrs;
          bVar5 = true;
        }
        else {
          pPVar8 = (PaUtilChannelDescriptor *)&bp->tempOutputBuffer;
          if ((bp->userOutputSampleFormatIsEqualToHost == 0) ||
             (pPVar9 = hostOutputChannels, bVar5 = true, bp->hostOutputIsInterleaved == 0)) {
LAB_001070fb:
            pPVar9 = pPVar8;
            bVar5 = bVar4;
          }
        }
        bVar4 = bVar5;
        pvVar18 = pPVar9->data;
      }
      iVar6 = (*bp->streamCallback)
                        (ppvVar16,pvVar18,uVar13,bp->timeInfo,bp->callbackStatusFlags,bp->userData);
      *streamCallbackResult = iVar6;
      if (iVar6 != 2) {
        auVar20._8_4_ = (int)(uVar13 >> 0x20);
        auVar20._0_8_ = uVar13;
        auVar20._12_4_ = 0x45300000;
        pPVar2 = bp->timeInfo;
        dVar21 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar14) - 4503599627370496.0)) * bp->samplePeriod;
        pPVar2->inputBufferAdcTime = pPVar2->inputBufferAdcTime + dVar21;
        pPVar2->outputBufferDacTime = dVar21 + pPVar2->outputBufferDacTime;
        uVar10 = bp->outputChannelCount;
        if (((ulong)uVar10 != 0) && (bp->hostOutputChannels[0]->data != (void *)0x0)) {
          if (bVar4) {
            uVar14 = bp->bytesPerHostOutputSample;
            lVar11 = 0;
            do {
              plVar1 = (long *)((long)&hostOutputChannels->data + lVar11);
              *plVar1 = *plVar1 + (ulong)*(uint *)((long)&hostOutputChannels->stride + lVar11) *
                                  uVar14 * uVar13;
              lVar11 = lVar11 + 0x10;
            } while ((ulong)uVar10 << 4 != lVar11);
          }
          else {
            if (bp->userOutputIsInterleaved == 0) {
              uVar7 = bp->bytesPerUserOutputSample * uVar14;
              uVar10 = 1;
            }
            else {
              uVar7 = bp->bytesPerUserOutputSample;
            }
            if (bp->outputChannelCount != 0) {
              pvVar18 = bp->tempOutputBuffer;
              uVar19 = 0;
              pPVar8 = hostOutputChannels;
              do {
                (*bp->outputConverter)
                          (pPVar8->data,pPVar8->stride,pvVar18,uVar10,uVar14,&bp->ditherGenerator);
                pvVar18 = (void *)((long)pvVar18 + (ulong)uVar7);
                pPVar8->data = (void *)((long)pPVar8->data +
                                       (ulong)bp->bytesPerHostOutputSample * pPVar8->stride * uVar13
                                       );
                uVar19 = uVar19 + 1;
                pPVar8 = pPVar8 + 1;
              } while (uVar19 < bp->outputChannelCount);
            }
          }
        }
        local_68 = local_68 + uVar13;
        framesToProcess = framesToProcess - uVar13;
      }
      if (framesToProcess == 0) {
        framesToProcess = 0;
        break;
      }
    } while (*streamCallbackResult == 0);
  }
  else {
    local_68 = 0;
  }
  if (framesToProcess != 0) {
    if (((bp->outputChannelCount != 0) && (bp->hostOutputChannels[0]->data != (void *)0x0)) &&
       (bp->outputChannelCount != 0)) {
      uVar13 = 0;
      do {
        (*bp->outputZeroer)(hostOutputChannels->data,hostOutputChannels->stride,
                            (uint)framesToProcess);
        hostOutputChannels->data =
             (void *)((long)hostOutputChannels->data +
                     (ulong)bp->bytesPerHostOutputSample *
                     hostOutputChannels->stride * framesToProcess);
        uVar13 = uVar13 + 1;
        hostOutputChannels = hostOutputChannels + 1;
      } while (uVar13 < bp->outputChannelCount);
    }
    local_68 = local_68 + framesToProcess;
  }
  return local_68;
}

Assistant:

static unsigned long NonAdaptingProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult,
        PaUtilChannelDescriptor *hostInputChannels,
        PaUtilChannelDescriptor *hostOutputChannels,
        unsigned long framesToProcess )
{
    void *userInput, *userOutput;
    unsigned char *srcBytePtr, *destBytePtr;
    unsigned int srcSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int srcChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int destSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int destChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;
    unsigned long frameCount;
    unsigned long framesToGo = framesToProcess;
    unsigned long framesProcessed = 0;
    int skipOutputConvert = 0;
    int skipInputConvert = 0;


    if( *streamCallbackResult == paContinue )
    {
        do
        {
            frameCount = PA_MIN_( bp->framesPerTempBuffer, framesToGo );

            /* configure user input buffer and convert input data (host -> user) */
            if( bp->inputChannelCount == 0 )
            {
                /* no input */
                userInput = 0;
            }
            else /* there are input channels */
            {
                
                destBytePtr = (unsigned char *)bp->tempInputBuffer;

                if( bp->userInputIsInterleaved )
                {
                    destSampleStrideSamples = bp->inputChannelCount;
                    destChannelStrideBytes = bp->bytesPerUserInputSample;

                    /* process host buffer directly, or use temp buffer if formats differ or host buffer non-interleaved */
                    if( bp->userInputSampleFormatIsEqualToHost && bp->hostInputIsInterleaved && bp->hostInputChannels[0][0].data)
                    {
                        userInput = hostInputChannels[0].data;
                        destBytePtr = (unsigned char *)hostInputChannels[0].data;
                        skipInputConvert = 1;
                    }
                    else
                    {
                        userInput = bp->tempInputBuffer;
                    }
                }
                else /* user input is not interleaved */
                {
                    destSampleStrideSamples = 1;
                    destChannelStrideBytes = frameCount * bp->bytesPerUserInputSample;

                    /* setup non-interleaved ptrs */
                    if( bp->userInputSampleFormatIsEqualToHost && !bp->hostInputIsInterleaved && bp->hostInputChannels[0][0].data )
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            bp->tempInputBufferPtrs[i] = hostInputChannels[i].data;
                        }
                        skipInputConvert = 1;
                    }
                    else
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            bp->tempInputBufferPtrs[i] = ((unsigned char*)bp->tempInputBuffer) +
                                i * bp->bytesPerUserInputSample * frameCount;
                        }
                    }
                
                    userInput = bp->tempInputBufferPtrs;
                }

                if( !bp->hostInputChannels[0][0].data )
                {
                    /* no input was supplied (see PaUtil_SetNoInput), so
                        zero the input buffer */

                    for( i=0; i<bp->inputChannelCount; ++i )
                    {
                        bp->inputZeroer( destBytePtr, destSampleStrideSamples, frameCount );
                        destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */
                    }
                }
                else
	            {
                    if( skipInputConvert )
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            /* advance src ptr for next iteration */
                            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                                    frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
                        }
                    }
                    else
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                                    hostInputChannels[i].data,
                                                    hostInputChannels[i].stride,
                                                    frameCount, &bp->ditherGenerator );

                            destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */

                            /* advance src ptr for next iteration */
                            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                                    frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
                        }
                    }
                }
            }

            /* configure user output buffer */
            if( bp->outputChannelCount == 0 )
            {
                /* no output */
                userOutput = 0;
            }
            else /* there are output channels */
            {
                if( bp->userOutputIsInterleaved )
                {
                    /* process host buffer directly, or use temp buffer if formats differ or host buffer non-interleaved */
                    if( bp->userOutputSampleFormatIsEqualToHost && bp->hostOutputIsInterleaved )
                    {
                        userOutput = hostOutputChannels[0].data;
                        skipOutputConvert = 1;
                    }
                    else
                    {
                        userOutput = bp->tempOutputBuffer;
                    }
                }
                else /* user output is not interleaved */
                {
                    if( bp->userOutputSampleFormatIsEqualToHost && !bp->hostOutputIsInterleaved )
                    {
                        for( i=0; i<bp->outputChannelCount; ++i )
                        {
                            bp->tempOutputBufferPtrs[i] = hostOutputChannels[i].data;
                        }
                        skipOutputConvert = 1;
                    }
                    else
                    {
                        for( i=0; i<bp->outputChannelCount; ++i )
                        {
                            bp->tempOutputBufferPtrs[i] = ((unsigned char*)bp->tempOutputBuffer) +
                                i * bp->bytesPerUserOutputSample * frameCount;
                        }
                    }

                    userOutput = bp->tempOutputBufferPtrs;
                }
            }
        
            *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                    frameCount, bp->timeInfo, bp->callbackStatusFlags, bp->userData );

            if( *streamCallbackResult == paAbort )
            {
                /* callback returned paAbort, don't advance framesProcessed
                        and framesToGo, they will be handled below */
            }
            else
            {
                bp->timeInfo->inputBufferAdcTime += frameCount * bp->samplePeriod;
                bp->timeInfo->outputBufferDacTime += frameCount * bp->samplePeriod;

                /* convert output data (user -> host) */
                
                if( bp->outputChannelCount != 0 && bp->hostOutputChannels[0][0].data )
                {
                    if( skipOutputConvert )
					{
						for( i=0; i<bp->outputChannelCount; ++i )
                    	{
                        	/* advance dest ptr for next iteration */
                        	hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                            	    frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
                    	}
					}
					else
					{

                    	srcBytePtr = (unsigned char *)bp->tempOutputBuffer;

                    	if( bp->userOutputIsInterleaved )
                    	{
                        	srcSampleStrideSamples = bp->outputChannelCount;
                        	srcChannelStrideBytes = bp->bytesPerUserOutputSample;
                    	}
                    	else /* user output is not interleaved */
                    	{
                        	srcSampleStrideSamples = 1;
                        	srcChannelStrideBytes = frameCount * bp->bytesPerUserOutputSample;
                    	}

                    	for( i=0; i<bp->outputChannelCount; ++i )
                    	{
                        	bp->outputConverter(    hostOutputChannels[i].data,
                                                	hostOutputChannels[i].stride,
                                                	srcBytePtr, srcSampleStrideSamples,
                                                	frameCount, &bp->ditherGenerator );

                        	srcBytePtr += srcChannelStrideBytes;  /* skip to next source channel */

                        	/* advance dest ptr for next iteration */
                        	hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                                		frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
                    	}
					}
                }
             
                framesProcessed += frameCount;

                framesToGo -= frameCount;
            }
        }
        while( framesToGo > 0  && *streamCallbackResult == paContinue );
    }

    if( framesToGo > 0 )
    {
        /* zero any remaining frames output. There will only be remaining frames
            if the callback has returned paComplete or paAbort */

        frameCount = framesToGo;

        if( bp->outputChannelCount != 0 && bp->hostOutputChannels[0][0].data )
        {
            for( i=0; i<bp->outputChannelCount; ++i )
            {
                bp->outputZeroer(   hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    frameCount );

                /* advance dest ptr for next iteration */
                hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                        frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
            }
        }

        framesProcessed += frameCount;
    }

    return framesProcessed;
}